

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

UBool hasValidTrailBytes(int32_t (*stateTable) [256],uint8_t state)

{
  UBool UVar1;
  int local_2c;
  int32_t entry;
  int32_t b;
  int32_t *row;
  uint8_t state_local;
  int32_t (*stateTable_local) [256];
  
  if ((stateTable[state][0xa1] < 0) && (((uint)stateTable[state][0xa1] >> 0x14 & 0xf) != 7)) {
    stateTable_local._7_1_ = '\x01';
  }
  else if ((stateTable[state][0x41] < 0) && (((uint)stateTable[state][0x41] >> 0x14 & 0xf) != 7)) {
    stateTable_local._7_1_ = '\x01';
  }
  else {
    for (local_2c = 0; local_2c < 0x100; local_2c = local_2c + 1) {
      if ((stateTable[state][local_2c] < 0) &&
         (((uint)stateTable[state][local_2c] >> 0x14 & 0xf) != 7)) {
        return '\x01';
      }
    }
    for (local_2c = 0; local_2c < 0x100; local_2c = local_2c + 1) {
      if ((-1 < stateTable[state][local_2c]) &&
         (UVar1 = hasValidTrailBytes(stateTable,(uint8_t)((uint)stateTable[state][local_2c] >> 0x18)
                                    ), UVar1 != '\0')) {
        return '\x01';
      }
    }
    stateTable_local._7_1_ = '\0';
  }
  return stateTable_local._7_1_;
}

Assistant:

static UBool
hasValidTrailBytes(const int32_t (*stateTable)[256], uint8_t state) {
    const int32_t *row=stateTable[state];
    int32_t b, entry;
    /* First test for final entries in this state for some commonly valid byte values. */
    entry=row[0xa1];
    if( !MBCS_ENTRY_IS_TRANSITION(entry) &&
        MBCS_ENTRY_FINAL_ACTION(entry)!=MBCS_STATE_ILLEGAL
    ) {
        return TRUE;
    }
    entry=row[0x41];
    if( !MBCS_ENTRY_IS_TRANSITION(entry) &&
        MBCS_ENTRY_FINAL_ACTION(entry)!=MBCS_STATE_ILLEGAL
    ) {
        return TRUE;
    }
    /* Then test for final entries in this state. */
    for(b=0; b<=0xff; ++b) {
        entry=row[b];
        if( !MBCS_ENTRY_IS_TRANSITION(entry) &&
            MBCS_ENTRY_FINAL_ACTION(entry)!=MBCS_STATE_ILLEGAL
        ) {
            return TRUE;
        }
    }
    /* Then recurse for transition entries. */
    for(b=0; b<=0xff; ++b) {
        entry=row[b];
        if( MBCS_ENTRY_IS_TRANSITION(entry) &&
            hasValidTrailBytes(stateTable, (uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry))
        ) {
            return TRUE;
        }
    }
    return FALSE;
}